

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadBinaryMinus<Fad<double>,_Fad<double>_> *this_00;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  
  vVar3 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::dx
                    (&this->left_->fadexpr_,i);
  this_00 = &this->right_->fadexpr_;
  dVar1 = this_00->left_->val_;
  dVar2 = this_00->right_->val_;
  vVar4 = FadBinaryMinus<Fad<double>,_Fad<double>_>::dx(this_00,i);
  vVar5 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::val
                    (&this->left_->fadexpr_);
  return vVar5 * vVar4 + (dVar1 - dVar2) * vVar3;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}